

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O3

void __thiscall
nn::ESoinn::initialize
          (ESoinn *this,pair<wv::AbstractWeightVector_*,_wv::AbstractWeightVector_*> *points,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *src_label)

{
  pointer pcVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
  *puVar2;
  pointer pcVar3;
  ConcreteLogger *pCVar4;
  uint32_t uVar5;
  uint uVar6;
  pointer pcVar7;
  pointer pcVar8;
  long lVar9;
  uint32_t i;
  ulong uVar10;
  undefined1 *local_128;
  long local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [24];
  string local_f0 [16];
  undefined1 local_e0 [16];
  undefined8 local_d0;
  double local_c8;
  double local_c0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b8;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [8];
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  coords1;
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  coords2;
  
  pCVar4 = log_netw;
  pcVar1 = local_108 + 0x10;
  local_108._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Initialize network","");
  logger::ConcreteLogger::debug(pCVar4,(string *)local_108,false);
  if ((pointer)local_108._0_8_ != pcVar1) {
    operator_delete((void *)local_108._0_8_);
  }
  uVar5 = (*points->first->_vptr_AbstractWeightVector[3])();
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_60,uVar5);
  uVar5 = (*points->second->_vptr_AbstractWeightVector[3])();
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&coords1.m_Size,uVar5);
  lVar9 = 0;
  uVar10 = 0;
  while( true ) {
    uVar6 = (*points->first->_vptr_AbstractWeightVector[3])();
    if (uVar6 <= uVar10) break;
    (*points->first->_vptr_AbstractWeightVector[2])
              ((string *)local_108,points->first,uVar10 & 0xffffffff);
    std::__cxx11::string::operator=
              ((string *)((long)&((_Alloc_hider *)local_60)->_M_p + lVar9),(string *)local_108);
    if ((pointer)local_108._0_8_ != pcVar1) {
      operator_delete((void *)local_108._0_8_);
    }
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 0x20;
  }
  lVar9 = 0;
  uVar10 = 0;
  while( true ) {
    uVar6 = (*points->second->_vptr_AbstractWeightVector[3])();
    if (uVar6 <= uVar10) break;
    (*points->second->_vptr_AbstractWeightVector[2])
              ((string *)local_108,points->second,uVar10 & 0xffffffff);
    std::__cxx11::string::operator=((string *)(coords1._8_8_ + lVar9),(string *)local_108);
    if ((pointer)local_108._0_8_ != pcVar1) {
      operator_delete((void *)local_108._0_8_);
    }
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 0x20;
  }
  pcVar7 = (pointer)operator_new(0x20);
  puVar2 = this->m_Distances;
  *(undefined ***)pcVar7 = &PTR_calcDistance_00147c68;
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(pcVar7 + 8),
              (StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_60);
  *(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
    **)(pcVar7 + 0x18) = puVar2;
  pcVar8 = (pointer)operator_new(0x20);
  puVar2 = this->m_Distances;
  *(undefined ***)pcVar8 = &PTR_calcDistance_00147c68;
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(pcVar8 + 8),
              (StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&coords1.m_Size);
  *(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
    **)(pcVar8 + 0x18) = puVar2;
  local_80 = local_70;
  pcVar3 = (src_label->first)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar3,pcVar3 + (src_label->first)._M_string_length);
  local_108._8_8_ = -1.0;
  local_108[0x10] = '\0';
  local_f0._0_8_ = local_e0;
  local_108._0_8_ = pcVar7;
  std::__cxx11::string::_M_construct<char*>(local_f0,local_80,local_80 + local_78);
  local_d0._0_4_ = 0;
  local_d0._4_4_ = 0;
  local_c8 = 1.0;
  local_c0 = 0.0;
  local_b8._M_bucket_count = 1;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
  emplace_back<neuron::ESoinnNeuron>(&this->m_Neurons,(ESoinnNeuron *)local_108);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_b8);
  if ((undefined1 *)local_f0._0_8_ != local_e0) {
    operator_delete((void *)local_f0._0_8_);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  pcVar3 = (src_label->second)._M_dataplus._M_p;
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar3,pcVar3 + (src_label->second)._M_string_length);
  local_108._8_8_ = -1.0;
  local_108[0x10] = '\0';
  local_f0._0_8_ = local_e0;
  local_108._0_8_ = pcVar8;
  std::__cxx11::string::_M_construct<char*>(local_f0,local_128,local_128 + local_120);
  local_d0._0_4_ = 0;
  local_d0._4_4_ = 0;
  local_c8 = 1.0;
  local_c0 = 0.0;
  local_b8._M_bucket_count = 1;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
  emplace_back<neuron::ESoinnNeuron>(&this->m_Neurons,(ESoinnNeuron *)local_108);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_b8);
  if ((undefined1 *)local_f0._0_8_ != local_e0) {
    operator_delete((void *)local_f0._0_8_);
  }
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  pCVar4 = log_netw;
  local_108._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_108,"Network is successfully initialized","");
  logger::ConcreteLogger::debug(pCVar4,(string *)local_108,false);
  if ((pointer)local_108._0_8_ != pcVar1) {
    operator_delete((void *)local_108._0_8_);
  }
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&coords1.m_Size);
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_60);
  return;
}

Assistant:

void ESoinn::initialize(const std::pair<wv::Point*, wv::Point*>& points, const std::pair<std::string, std::string>& src_label)
    {
        log_netw->debug("Initialize network");
        //if (m_NumDimensions != points.first->getNumDimensions())
        //    throw std::runtime_error("Number of dimensions for data doesn't correspond dimension of neural network");
        cont::StaticArray<std::string> coords1(points.first->getNumDimensions());
        cont::StaticArray<std::string> coords2(points.second->getNumDimensions());

        for (uint32_t i = 0; i < points.first->getNumDimensions(); i++)
        {
            coords1[i] = points.first->getConcreteCoord(i);
        }
        
        for (uint32_t i = 0; i < points.second->getNumDimensions(); i++)
        {
            coords2[i] = points.second->getConcreteCoord(i);
        }
        
        wv::WeightVectorPhrase* sWeightVector1 = new wv::WeightVectorPhrase(coords1, m_Distances);
        wv::WeightVectorPhrase* sWeightVector2 = new wv::WeightVectorPhrase(coords2, m_Distances);
        m_Neurons.push_back(neuron::ESoinnNeuron(sWeightVector1, src_label.first));
        m_Neurons.push_back(neuron::ESoinnNeuron(sWeightVector2, src_label.second));
        
        log_netw->debug("Network is successfully initialized");
    }